

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::analysis::DebugInfoManager::GetDebugInfoNone(DebugInfoManager *this)

{
  IRContext *this_00;
  uint32_t res_id;
  uint32_t ty_id;
  Instruction *pIVar1;
  TypeManager *this_01;
  DefUseManager *this_02;
  long lVar2;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_108;
  uint local_100;
  uint32_t local_fc;
  undefined1 local_f8 [48];
  undefined4 local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  SmallVector<unsigned_int,_2UL> local_98;
  SmallVector<unsigned_int,_2UL> local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pIVar1 = this->debug_info_none_inst_;
  if (pIVar1 == (Instruction *)0x0) {
    res_id = IRContext::TakeNextId(this->context_);
    pIVar1 = (Instruction *)::operator_new(0x70);
    this_00 = this->context_;
    this_01 = IRContext::get_type_mgr(this_00);
    ty_id = TypeManager::GetVoidTypeId(this_01);
    local_fc = GetDbgSetImportId(this);
    init_list._M_len = 1;
    init_list._M_array = &local_fc;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list);
    local_f8._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_f8 + 8),&local_70);
    local_100 = 0;
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_100;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,init_list_00);
    local_c8 = 7;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,&local_98);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
               local_f8,&local_98);
    Instruction::Instruction(pIVar1,this_00,OpExtInst,ty_id,res_id,(OperandList *)&local_48);
    local_108._M_head_impl = pIVar1;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48)
    ;
    lVar2 = 0x38;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_f8 + lVar2));
      lVar2 = lVar2 + -0x30;
    } while (lVar2 != -0x28);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
    pIVar1 = Instruction::InsertBefore
                       ((((this->context_->module_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                          .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                        ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.
                        sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_,
                        (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&local_108);
    this->debug_info_none_inst_ = pIVar1;
    RegisterDbgInst(this,pIVar1);
    if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      this_02 = IRContext::get_def_use_mgr(this->context_);
      DefUseManager::AnalyzeInstDefUse(this_02,this->debug_info_none_inst_);
    }
    pIVar1 = this->debug_info_none_inst_;
    if (local_108._M_head_impl != (Instruction *)0x0) {
      (*((local_108._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
  }
  return pIVar1;
}

Assistant:

Instruction* DebugInfoManager::GetDebugInfoNone() {
  if (debug_info_none_inst_ != nullptr) return debug_info_none_inst_;

  uint32_t result_id = context()->TakeNextId();
  std::unique_ptr<Instruction> dbg_info_none_inst(new Instruction(
      context(), spv::Op::OpExtInst, context()->get_type_mgr()->GetVoidTypeId(),
      result_id,
      {
          {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {GetDbgSetImportId()}},
          {spv_operand_type_t::SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
           {static_cast<uint32_t>(CommonDebugInfoDebugInfoNone)}},
      }));

  // Add to the front of |ext_inst_debuginfo_|.
  debug_info_none_inst_ =
      context()->module()->ext_inst_debuginfo_begin()->InsertBefore(
          std::move(dbg_info_none_inst));

  RegisterDbgInst(debug_info_none_inst_);
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(debug_info_none_inst_);
  return debug_info_none_inst_;
}